

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader.hpp
# Opt level: O2

buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
* __thiscall
pstore::http::
make_buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>>
          (buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
           *__return_storage_ptr__,http *this,
          function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
          *refiller,size_t buffer_size)

{
  function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  fStack_38;
  
  std::
  function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::function(&fStack_38,
             (function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
              *)this);
  buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>_>
  ::buffered_reader(__return_storage_ptr__,&fStack_38,(size_t)refiller);
  std::_Function_base::~_Function_base(&fStack_38.super__Function_base);
  return __return_storage_ptr__;
}

Assistant:

buffered_reader<IO, RefillFunction>
        make_buffered_reader (RefillFunction refiller,
                              std::size_t buffer_size = default_buffer_size) {
            return buffered_reader<IO, RefillFunction> (refiller, buffer_size);
        }